

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPlayTree.h
# Opt level: O2

SPlayTree<int> * __thiscall BinTrees::SPlayTree<int>::i<int_const&>(SPlayTree<int> *this,int *v)

{
  BinTree<int> *x;
  BinTree<int> *pBVar1;
  BinTree<int> *pBVar2;
  BinTree<int> **ppBVar3;
  BinTree<int> *pBVar4;
  runtime_error *this_00;
  BinTree<int> *x_00;
  BinTree<int> *xp;
  
  xp = (BinTree<int> *)0x0;
  ppBVar3 = BinSTree<int>::unsafe_search(&this->super_BinSTree<int>,v,&xp);
  if (*ppBVar3 != (BinTree<int> *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Repeated insert.");
LAB_00102401:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar4 = (BinTree<int> *)operator_new(0x20);
  pBVar4->v = *v;
  pBVar4->l = (BinTree<int> *)0x0;
  pBVar4->r = (BinTree<int> *)0x0;
  pBVar4->p = xp;
  *ppBVar3 = pBVar4;
  x_00 = xp;
  do {
    if (x_00 == (BinTree<int> *)0x0) {
      return this;
    }
    x = x_00->p;
    if (x == (BinTree<int> *)0x0) {
      if (pBVar4 != x_00->l) goto LAB_001023b1;
LAB_001023c7:
      this = (SPlayTree<int> *)BinSTree<int>::RR(&this->super_BinSTree<int>,(BinSTree<int> *)x_00);
    }
    else {
      pBVar1 = x->l;
      if ((pBVar1 != (BinTree<int> *)0x0) && (pBVar4 == pBVar1->l)) {
        this = (SPlayTree<int> *)BinSTree<int>::RR(&this->super_BinSTree<int>,(BinSTree<int> *)x);
LAB_001023c0:
        x_00 = pBVar4->p;
        goto LAB_001023c7;
      }
      pBVar2 = x->r;
      if ((pBVar2 == (BinTree<int> *)0x0) || (pBVar4 != pBVar2->r)) {
        if ((pBVar1 != (BinTree<int> *)0x0) && (pBVar4 == pBVar1->r)) {
          this = (SPlayTree<int> *)
                 BinSTree<int>::LR(&this->super_BinSTree<int>,(BinSTree<int> *)x_00);
          goto LAB_001023c0;
        }
        if ((pBVar2 == (BinTree<int> *)0x0) || (pBVar4 != pBVar2->l)) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"whoops!");
          goto LAB_00102401;
        }
        this = (SPlayTree<int> *)BinSTree<int>::RR(&this->super_BinSTree<int>,(BinSTree<int> *)x_00)
        ;
      }
      else {
        this = (SPlayTree<int> *)BinSTree<int>::LR(&this->super_BinSTree<int>,(BinSTree<int> *)x);
      }
      x_00 = pBVar4->p;
LAB_001023b1:
      this = (SPlayTree<int> *)BinSTree<int>::LR(&this->super_BinSTree<int>,(BinSTree<int> *)x_00);
    }
    x_00 = pBVar4->p;
  } while( true );
}

Assistant:

SPlayTree<T> *SPlayTree<T>::i(F &&v) {
        BinTree<T> *xp = nullptr;
        BinTree<T> *&ip = this->unsafe_search(v, xp);
        auto root = this;
        if (ip) throw std::runtime_error("Repeated insert.");
        else {
            ip = new SPlayTree(std::forward<F>(v), xp);
        }
        auto i = static_cast<SPlayTree<T> *>(ip);
        while (i->P()) {
            if (i->P()->P() == nullptr) {
                if (i == i->p()->l())
                    root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
                else
                    root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->l() && i == i->p()->p()->l()->l()) {
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p()->p())));
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->r() && i == i->p()->p()->r()->r()) {
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p()->p())));
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->l() && i == i->p()->p()->l()->r()) {
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->r() && i == i->p()->p()->r()->l()) {
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else throw std::runtime_error("whoops!");
        }

        return root;
    }